

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::AsmJsByteCodeWriter::AsmReg9
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8)

{
  Data *this_00;
  bool bVar1;
  RegSlot local_5c;
  RegSlot local_58;
  RegSlot local_54;
  RegSlot local_50;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  local_38 = R3;
  local_34 = R2;
  bVar1 = TryWriteAsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,R0,R1,R2,R3,R4,R5,R6,R7,R8);
  if (!bVar1) {
    bVar1 = TryWriteAsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op,R0,R1,local_34,local_38,R4,R5,R6,R7,R8);
    if (!bVar1) {
      local_54 = local_34;
      local_50 = local_38;
      local_4c = R4;
      local_48 = R5;
      local_44 = R6;
      local_40 = R7;
      local_3c = R8;
      this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
      local_5c = R0;
      local_58 = R1;
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,&this->super_ByteCodeWriter,false)
      ;
      ByteCodeWriter::Data::Write(this_00,&local_5c,0x24);
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmReg9(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8)
    {
        MULTISIZE_LAYOUT_WRITE(AsmReg9, op, R0, R1, R2, R3, R4, R5, R6, R7, R8);
    }